

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

_Bool MatrixCompareLoose(Matrix *a,Matrix *b,Real error)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  ulong uVar5;
  _Bool _Var6;
  uint uVar7;
  uint uVar8;
  Matrix *a_00;
  uint32_t rows;
  bool bVar9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar12;
  
  uVar8 = a->rows;
  uVar5 = (ulong)uVar8;
  uVar7 = a->columns;
  if ((uVar8 == b->rows) && (uVar7 == b->columns)) {
    _Var6 = true;
    if (uVar8 != 0) {
      a_00 = (Matrix *)0x0;
      lVar12 = in_ST6;
      do {
        bVar9 = uVar7 != 0;
        uVar7 = 0;
        if (bVar9) {
          rows = 0;
          lVar10 = in_ST0;
          lVar11 = in_ST1;
          lVar1 = in_ST2;
          lVar2 = in_ST3;
          lVar3 = in_ST4;
          lVar4 = in_ST5;
          in_ST5 = lVar12;
          do {
            in_ST4 = in_ST6;
            in_ST3 = lVar4;
            in_ST2 = lVar3;
            in_ST1 = lVar2;
            in_ST0 = lVar1;
            MatrixGetElement((Real *)a,a_00,rows,(uint32_t)uVar5);
            MatrixGetElement((Real *)b,a_00,rows,(uint32_t)uVar5);
            if (error._0_10_ <= ABS(lVar10 - lVar11)) {
              return false;
            }
            rows = rows + 1;
            uVar7 = a->columns;
            lVar10 = in_ST0;
            lVar11 = in_ST1;
            lVar1 = in_ST2;
            lVar2 = in_ST3;
            lVar3 = in_ST4;
            lVar4 = in_ST5;
            in_ST6 = in_ST5;
          } while (rows < uVar7);
          uVar5 = (ulong)a->rows;
          lVar12 = in_ST5;
        }
        uVar8 = (int)a_00 + 1;
        a_00 = (Matrix *)(ulong)uVar8;
      } while (uVar8 < (uint)uVar5);
    }
  }
  else {
    _Var6 = false;
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixCompareLoose");
  }
  return _Var6;
}

Assistant:

bool MatrixCompareLoose(const Matrix *a, const Matrix *b, Real error) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return false;
  }
#endif
  for (uint32_t row = 0; row < a->rows; ++row) {
    for (uint32_t col = 0; col < a->columns; ++col) {
      if (fabsl(MatrixGetElement(a, row, col) - MatrixGetElement(b, row, col)) >= error) {
        return false;
      }
    }
  }
  return true;
}